

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
try_seek(iterator *this,art_key_type search_key,bool *match,bool fwd)

{
  long *plVar1;
  atomic<long> *paVar2;
  byte bVar3;
  ulong uVar4;
  node_type nVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  node_ptr nVar10;
  stack_entry *psVar11;
  long lVar12;
  void *extraout_RDX;
  undefined1 uVar13;
  version_type *this_00;
  byte type;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *this_01;
  byte key_byte;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *pbVar14;
  optimistic_lock *poVar15;
  find_result fVar16;
  undefined1 local_e0 [8];
  iter_result_opt cnxt;
  undefined1 local_a8 [8];
  iter_result_opt nxt;
  art_key_type remaining_key;
  key_prefix_snapshot key_prefix;
  undefined1 local_60 [8];
  read_critical_section c_critical_section;
  read_critical_section parent_critical_section;
  read_critical_section node_critical_section;
  
  if ((this->stack_).c.
      super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->stack_).c.
      super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ::pop_back(&(this->stack_).c);
    } while ((this->stack_).c.
             super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->stack_).c.
             super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  *match = false;
  this_00 = &c_critical_section.version;
  optimistic_lock::try_read_lock((optimistic_lock *)this_00);
  if (c_critical_section.version.version != 0) {
    key_prefix = (key_prefix_snapshot)(this->db_->root).value._M_i.tagged_ptr;
    if (key_prefix.u64 == 0) {
      olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::try_seek();
      uVar13 = local_a8[0];
      goto LAB_001405d7;
    }
    bVar7 = optimistic_lock::check
                      ((optimistic_lock *)c_critical_section.version.version,
                       (version_type)parent_critical_section.lock);
    if (bVar7) {
      cnxt.
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _24_8_ = &this->stack_;
      nxt.
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _24_8_ = search_key.field_0;
      do {
        if (key_prefix.u64 == 0) {
          __assert_fail("node != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                        ,0x90a,
                        "bool unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::try_seek(art_key_type, bool &, bool) [Key = unsigned long, Value = std::span<const std::byte>]"
                       );
        }
        this_01 = (basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                  (key_prefix.u64 & 0xfffffffffffffff8);
        optimistic_lock::try_read_lock((optimistic_lock *)&parent_critical_section.version);
        if (parent_critical_section.version.version == 0) {
LAB_001404c2:
          bVar7 = false;
          this_00 = (version_type *)0x0;
        }
        else {
          bVar7 = optimistic_lock::check
                            ((optimistic_lock *)c_critical_section.version.version,
                             (version_type)parent_critical_section.lock);
          uVar6 = nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                  ._24_8_;
          if (!bVar7) {
LAB_001404ba:
            c_critical_section.version.version = 0;
            goto LAB_001404c2;
          }
          type = key_prefix.f.key_prefix._M_elems[0] & 7;
          if ((key_prefix.u64 & 7) == 0) {
            if (*(long *)(c_critical_section.version.version + 8) < 1) goto LAB_00140616;
            poVar15 = *(optimistic_lock **)c_critical_section.version.version;
            if (parent_critical_section.lock != poVar15) {
              LOCK();
              plVar1 = (long *)(c_critical_section.version.version + 8);
              lVar12 = *plVar1;
              *plVar1 = *plVar1 + -1;
              UNLOCK();
              if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
              if (parent_critical_section.lock != poVar15) goto LAB_001404ba;
            }
            LOCK();
            plVar1 = (long *)(c_critical_section.version.version + 8);
            lVar12 = *plVar1;
            *plVar1 = *plVar1 + -1;
            UNLOCK();
            if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
            c_critical_section.version.version = 0;
            if (parent_critical_section.lock == poVar15) {
              nxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
              ._M_payload._M_value.node.tagged_ptr._0_2_ = 0xffff;
              nxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
              ._M_payload._8_8_ = 0;
              nxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
              ._M_payload._M_value.prefix = (key_prefix_snapshot)node_critical_section.lock;
              local_a8 = (undefined1  [8])key_prefix;
              std::
              deque<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>
              ::
              emplace_back<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>
                        ((deque<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>
                          *)cnxt.
                            super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                            ._24_8_,(stack_entry *)local_a8);
              iVar9 = detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::cmp
                                (this_01,(void *)search_key.field_0,extraout_RDX);
              if (*(long *)(parent_critical_section.version.version + 8) < 1) {
LAB_00140616:
                __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                              ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
              }
              poVar15 = *(optimistic_lock **)parent_critical_section.version.version;
              if (node_critical_section.lock != poVar15) {
                LOCK();
                plVar1 = (long *)(parent_critical_section.version.version + 8);
                lVar12 = *plVar1;
                *plVar1 = *plVar1 + -1;
                UNLOCK();
                if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
                if (node_critical_section.lock != poVar15) goto LAB_001404e0;
              }
              LOCK();
              plVar1 = (long *)(parent_critical_section.version.version + 8);
              lVar12 = *plVar1;
              *plVar1 = *plVar1 + -1;
              UNLOCK();
              if (SBORROW8(lVar12,1) != *plVar1 < 0) {
LAB_001405f7:
                __assert_fail("old_value > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                              ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
              }
              parent_critical_section.version.version = 0;
              if (node_critical_section.lock == poVar15) {
                if (iVar9 != 0) {
                  if (fwd) {
                    if (iVar9 < 0) goto LAB_0013ff84;
                    bVar7 = try_next(this);
                    uVar8 = (uint)bVar7;
                  }
                  else {
                    if (0 < iVar9) goto LAB_0013ff84;
                    bVar7 = try_prior(this);
                    uVar8 = (uint)bVar7;
                  }
                  goto LAB_00140122;
                }
                *match = true;
LAB_0013ff84:
                this_00 = (version_type *)0x1;
                goto LAB_00140124;
              }
            }
            goto LAB_001404c2;
          }
          remaining_key.field_0 =
               (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
               *(anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 *)&this_01->key_size;
          uVar13 = remaining_key.field_0.key_bytes._M_elems[7];
          uVar8 = detail::key_prefix_snapshot::get_shared_length
                            ((key_prefix_snapshot *)&remaining_key,
                             nxt.
                             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                             ._24_8_);
          if (uVar8 < (byte)uVar13) {
            if (7 < uVar8) {
              __assert_fail("index < sizeof(KeyType)",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                            ,0x90,
                            "auto unodb::detail::basic_art_key<unsigned long>::operator[](std::size_t) const [KeyType = unsigned long]"
                           );
            }
            if (remaining_key.field_0.key_bytes._M_elems[7] <= uVar8) {
              __assert_fail("i < length()",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                            ,0x248,
                            "auto unodb::detail::key_prefix_snapshot::operator[](std::size_t) const"
                           );
            }
            bVar7 = (&nxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                      ._M_engaged)[uVar8];
            bVar3 = *(byte *)((long)&remaining_key.field_0 + (ulong)uVar8);
            if (bVar7 == (bool)bVar3) {
              __assert_fail("cmp_ != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                            ,0x93b,
                            "bool unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::try_seek(art_key_type, bool &, bool) [Key = unsigned long, Value = std::span<const std::byte>]"
                           );
            }
            if (fwd) {
              if (bVar3 <= bVar7) {
                bVar7 = try_right_most_traversal
                                  (this,(olc_node_ptr)key_prefix.f,
                                   (read_critical_section *)&c_critical_section.version);
                if (*(long *)(parent_critical_section.version.version + 8) < 1) goto LAB_00140616;
                poVar15 = *(optimistic_lock **)parent_critical_section.version.version;
                LOCK();
                plVar1 = (long *)(parent_critical_section.version.version + 8);
                lVar12 = *plVar1;
                *plVar1 = *plVar1 + -1;
                UNLOCK();
                if (node_critical_section.lock == poVar15) {
                  if (lVar12 < 1) goto LAB_001405f7;
                }
                else {
                  olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator
                  ::try_seek((void *)(ulong)(0 < lVar12));
                }
                parent_critical_section.version.version = 0;
                if (!bVar7 || node_critical_section.lock != poVar15) goto LAB_001404c2;
                bVar7 = try_next(this);
                uVar8 = (uint)bVar7;
LAB_00140122:
                this_00 = (version_type *)(ulong)uVar8;
                goto LAB_00140124;
              }
              bVar7 = try_left_most_traversal
                                (this,(olc_node_ptr)key_prefix.f,
                                 (read_critical_section *)&c_critical_section.version);
              if (*(long *)(parent_critical_section.version.version + 8) < 1) goto LAB_00140616;
              poVar15 = *(optimistic_lock **)parent_critical_section.version.version;
              LOCK();
              plVar1 = (long *)(parent_critical_section.version.version + 8);
              lVar12 = *plVar1;
              *plVar1 = *plVar1 + -1;
              UNLOCK();
              if (node_critical_section.lock == poVar15) {
LAB_00140032:
                if (lVar12 < 1) goto LAB_001405f7;
              }
              else {
                olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::
                try_seek((void *)(ulong)(0 < lVar12));
              }
            }
            else {
              if (bVar7 < bVar3) {
                bVar7 = try_left_most_traversal
                                  (this,(olc_node_ptr)key_prefix.f,
                                   (read_critical_section *)&c_critical_section.version);
                if (*(long *)(parent_critical_section.version.version + 8) < 1) goto LAB_00140616;
                poVar15 = *(optimistic_lock **)parent_critical_section.version.version;
                LOCK();
                plVar1 = (long *)(parent_critical_section.version.version + 8);
                lVar12 = *plVar1;
                *plVar1 = *plVar1 + -1;
                UNLOCK();
                if (node_critical_section.lock == poVar15) {
                  if (lVar12 < 1) goto LAB_001405f7;
                }
                else {
                  olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator
                  ::try_seek((void *)(ulong)(0 < lVar12));
                }
                parent_critical_section.version.version = 0;
                if (!bVar7 || node_critical_section.lock != poVar15) goto LAB_001404c2;
                bVar7 = try_prior(this);
                uVar8 = (uint)bVar7;
                goto LAB_00140122;
              }
              bVar7 = try_right_most_traversal
                                (this,(olc_node_ptr)key_prefix.f,
                                 (read_critical_section *)&c_critical_section.version);
              if (*(long *)(parent_critical_section.version.version + 8) < 1) goto LAB_00140616;
              poVar15 = *(optimistic_lock **)parent_critical_section.version.version;
              LOCK();
              plVar1 = (long *)(parent_critical_section.version.version + 8);
              lVar12 = *plVar1;
              *plVar1 = *plVar1 + -1;
              UNLOCK();
              if (node_critical_section.lock == poVar15) goto LAB_00140032;
              olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::
              try_seek((void *)(ulong)(0 < lVar12));
            }
            parent_critical_section.version.version = 0;
            this_00 = (version_type *)(ulong)(byte)(bVar7 & node_critical_section.lock == poVar15);
LAB_00140124:
            bVar7 = false;
          }
          else {
            if (8 < (byte)uVar13) {
              __assert_fail("num_bytes <= sizeof(KeyType)",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                            ,0xc3,
                            "void unodb::detail::basic_art_key<unsigned long>::shift_right(const std::size_t) [KeyType = unsigned long]"
                           );
            }
            nxt.
            super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
            ._24_8_ = (ulong)uVar6 >> ((uVar13 & 7) << 3);
            key_byte = (byte)nxt.
                             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                             ._24_8_;
            fVar16 = detail::
                     basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                     ::find_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                   *)this_01,type,key_byte);
            if ((key_prefix_snapshot *)fVar16.second == (key_prefix_snapshot *)0x0) {
              if (fwd) {
                detail::
                basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                ::gte_key_byte((iter_result_opt *)local_a8,
                               (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                *)this_01,type,key_byte);
                if (nxt.
                    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                    ._M_payload._16_1_ == '\0') {
                  if (*(long *)(c_critical_section.version.version + 8) < 1) goto LAB_00140616;
                  poVar15 = *(optimistic_lock **)c_critical_section.version.version;
                  if (parent_critical_section.lock != poVar15) {
                    LOCK();
                    plVar1 = (long *)(c_critical_section.version.version + 8);
                    lVar12 = *plVar1;
                    *plVar1 = *plVar1 + -1;
                    UNLOCK();
                    if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
                    if (parent_critical_section.lock != poVar15) {
LAB_00140579:
                      c_critical_section.version.version = 0;
                      goto LAB_001405ad;
                    }
                  }
                  LOCK();
                  plVar1 = (long *)(c_critical_section.version.version + 8);
                  lVar12 = *plVar1;
                  *plVar1 = *plVar1 + -1;
                  UNLOCK();
                  if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
                  c_critical_section.version.version = 0;
                  if (parent_critical_section.lock == poVar15) {
                    if (*(long *)(parent_critical_section.version.version + 8) < 1)
                    goto LAB_00140616;
                    poVar15 = *(optimistic_lock **)parent_critical_section.version.version;
                    if (node_critical_section.lock != poVar15) {
                      LOCK();
                      plVar1 = (long *)(parent_critical_section.version.version + 8);
                      lVar12 = *plVar1;
                      *plVar1 = *plVar1 + -1;
                      UNLOCK();
                      if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
                      if (node_critical_section.lock != poVar15) goto LAB_001405a5;
                    }
                    LOCK();
                    plVar1 = (long *)(parent_critical_section.version.version + 8);
                    lVar12 = *plVar1;
                    *plVar1 = *plVar1 + -1;
                    UNLOCK();
                    if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
                    parent_critical_section.version.version = 0;
                    if (node_critical_section.lock != poVar15) goto LAB_001405ad;
                    if ((this->stack_).c.
                        super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                        (this->stack_).c.
                        super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                      pop(this);
                    }
                    do {
                      if ((this->stack_).c.
                          super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          (this->stack_).c.
                          super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0013ff84;
                      psVar11 = top(this);
                      uVar4 = (psVar11->super_iter_result).node.tagged_ptr;
                      pbVar14 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                 *)(uVar4 & 0xfffffffffffffff8);
                      c_critical_section.lock = (optimistic_lock *)psVar11->version;
                      LOCK();
                      paVar2 = &(pbVar14->super_header_type).m_lock.read_lock_count;
                      (paVar2->super___atomic_base<long>)._M_i =
                           (paVar2->super___atomic_base<long>)._M_i + 1;
                      UNLOCK();
                      local_60 = (undefined1  [8])pbVar14;
                      bVar7 = optimistic_lock::check
                                        ((optimistic_lock *)pbVar14,
                                         (version_type)c_critical_section.lock);
                      if (bVar7) {
                        nVar5 = (node_type)uVar4;
                        detail::
                        basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                        ::next((iter_result_opt *)local_e0,pbVar14,nVar5 & (I256|I48),
                               (psVar11->super_iter_result).child_index);
                        if (cnxt.
                            super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                            ._M_payload._16_1_ == '\x01') {
                          nVar10 = detail::
                                   basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                   ::get_child(pbVar14,nVar5 & (I256|I48),
                                               (psVar11->super_iter_result).child_index);
                          bVar7 = optimistic_lock::check
                                            ((optimistic_lock *)local_60,
                                             (version_type)c_critical_section.lock);
                          if (!bVar7) goto LAB_001402d3;
                          bVar7 = try_left_most_traversal
                                            (this,(olc_node_ptr)nVar10.tagged_ptr,
                                             (read_critical_section *)local_60);
                          this_00 = (version_type *)(ulong)bVar7;
                          bVar7 = false;
                        }
                        else {
                          pop(this);
                          if ((((header_type *)local_60)->m_lock).read_lock_count.
                              super___atomic_base<long>._M_i < 1) goto LAB_00140616;
                          poVar15 = (optimistic_lock *)
                                    (((header_type *)local_60)->m_lock).version.version.
                                    super___atomic_base<unsigned_long>._M_i;
                          bVar7 = c_critical_section.lock == poVar15;
                          if (bVar7) {
LAB_001402a1:
                            LOCK();
                            paVar2 = &(((header_type *)local_60)->m_lock).read_lock_count;
                            lVar12 = (paVar2->super___atomic_base<long>)._M_i;
                            (paVar2->super___atomic_base<long>)._M_i =
                                 (paVar2->super___atomic_base<long>)._M_i + -1;
                            UNLOCK();
                            if (SBORROW8(lVar12,1) != (paVar2->super___atomic_base<long>)._M_i < 0)
                            goto LAB_001405f7;
                          }
                          else {
                            LOCK();
                            paVar2 = &(((header_type *)local_60)->m_lock).read_lock_count;
                            lVar12 = (paVar2->super___atomic_base<long>)._M_i;
                            (paVar2->super___atomic_base<long>)._M_i =
                                 (paVar2->super___atomic_base<long>)._M_i + -1;
                            UNLOCK();
                            if (SBORROW8(lVar12,1) != (paVar2->super___atomic_base<long>)._M_i < 0)
                            goto LAB_001405f7;
                            if (c_critical_section.lock == poVar15) goto LAB_001402a1;
                          }
                          local_60 = (undefined1  [8])0x0;
                          this_00 = (version_type *)
                                    (ulong)((byte)this_00 & c_critical_section.lock == poVar15);
                        }
                      }
                      else {
LAB_001402d3:
                        local_60 = (undefined1  [8])0x0;
                        bVar7 = false;
                        this_00 = (version_type *)0x0;
                      }
                      optimistic_lock::read_critical_section::~read_critical_section
                                ((read_critical_section *)local_60);
                    } while (bVar7);
                    goto LAB_00140124;
                  }
                }
                else {
                  uVar13 = nxt.
                           super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                           ._M_payload._M_value.node.tagged_ptr._1_1_;
                  nVar10 = detail::
                           basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                           ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                        *)this_01,type,
                                       nxt.
                                       super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                       ._M_payload._M_value.node.tagged_ptr._1_1_);
                  bVar7 = optimistic_lock::check
                                    ((optimistic_lock *)parent_critical_section.version.version,
                                     (version_type)node_critical_section.lock);
                  if (bVar7) {
                    if (*(long *)(c_critical_section.version.version + 8) < 1) goto LAB_00140616;
                    poVar15 = *(optimistic_lock **)c_critical_section.version.version;
                    if (parent_critical_section.lock != poVar15) {
                      LOCK();
                      plVar1 = (long *)(c_critical_section.version.version + 8);
                      lVar12 = *plVar1;
                      *plVar1 = *plVar1 + -1;
                      UNLOCK();
                      if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
                      if (parent_critical_section.lock != poVar15) goto LAB_00140579;
                    }
                    LOCK();
                    plVar1 = (long *)(c_critical_section.version.version + 8);
                    lVar12 = *plVar1;
                    *plVar1 = *plVar1 + -1;
                    UNLOCK();
                    if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
                    c_critical_section.version.version = 0;
                    if (parent_critical_section.lock == poVar15) {
                      bVar7 = try_push(this,(olc_node_ptr)key_prefix.f,
                                       nxt.
                                       super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                       ._M_payload._M_value.node.tagged_ptr._0_1_,uVar13,
                                       (key_prefix_snapshot)
                                       nxt.
                                       super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                       ._M_payload._8_8_,
                                       (read_critical_section *)&parent_critical_section.version);
                      if (bVar7) {
                        bVar7 = try_left_most_traversal
                                          (this,(olc_node_ptr)nVar10.tagged_ptr,
                                           (read_critical_section *)&parent_critical_section.version
                                          );
                        uVar8 = (uint)bVar7;
                        goto LAB_00140122;
                      }
                    }
                  }
                  else {
LAB_001405a5:
                    parent_critical_section.version.version = 0;
                  }
                }
              }
              else {
                detail::
                basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                ::lte_key_byte((iter_result_opt *)local_a8,
                               (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                *)this_01,type,key_byte);
                if (nxt.
                    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                    ._M_payload._16_1_ == '\0') {
                  if (*(long *)(c_critical_section.version.version + 8) < 1) goto LAB_00140616;
                  poVar15 = *(optimistic_lock **)c_critical_section.version.version;
                  if (parent_critical_section.lock != poVar15) {
                    LOCK();
                    plVar1 = (long *)(c_critical_section.version.version + 8);
                    lVar12 = *plVar1;
                    *plVar1 = *plVar1 + -1;
                    UNLOCK();
                    if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
                    if (parent_critical_section.lock != poVar15) goto LAB_00140579;
                  }
                  LOCK();
                  plVar1 = (long *)(c_critical_section.version.version + 8);
                  lVar12 = *plVar1;
                  *plVar1 = *plVar1 + -1;
                  UNLOCK();
                  if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
                  c_critical_section.version.version = 0;
                  if (parent_critical_section.lock == poVar15) {
                    if (*(long *)(parent_critical_section.version.version + 8) < 1)
                    goto LAB_00140616;
                    poVar15 = *(optimistic_lock **)parent_critical_section.version.version;
                    if (node_critical_section.lock != poVar15) {
                      LOCK();
                      plVar1 = (long *)(parent_critical_section.version.version + 8);
                      lVar12 = *plVar1;
                      *plVar1 = *plVar1 + -1;
                      UNLOCK();
                      if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
                      if (node_critical_section.lock != poVar15) goto LAB_001405a5;
                    }
                    LOCK();
                    plVar1 = (long *)(parent_critical_section.version.version + 8);
                    lVar12 = *plVar1;
                    *plVar1 = *plVar1 + -1;
                    UNLOCK();
                    if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
                    parent_critical_section.version.version = 0;
                    if (node_critical_section.lock == poVar15) {
                      if ((this->stack_).c.
                          super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                          (this->stack_).c.
                          super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                        pop(this);
                      }
                      do {
                        if ((this->stack_).c.
                            super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                            (this->stack_).c.
                            super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0013ff84;
                        psVar11 = top(this);
                        uVar4 = (psVar11->super_iter_result).node.tagged_ptr;
                        pbVar14 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                   *)(uVar4 & 0xfffffffffffffff8);
                        c_critical_section.lock = (optimistic_lock *)psVar11->version;
                        LOCK();
                        paVar2 = &(pbVar14->super_header_type).m_lock.read_lock_count;
                        (paVar2->super___atomic_base<long>)._M_i =
                             (paVar2->super___atomic_base<long>)._M_i + 1;
                        UNLOCK();
                        local_60 = (undefined1  [8])pbVar14;
                        bVar7 = optimistic_lock::check
                                          ((optimistic_lock *)pbVar14,
                                           (version_type)c_critical_section.lock);
                        if (bVar7) {
                          nVar5 = (node_type)uVar4;
                          detail::
                          basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                          ::prior((iter_result_opt *)local_e0,pbVar14,nVar5 & (I256|I48),
                                  (psVar11->super_iter_result).child_index);
                          if (cnxt.
                              super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                              ._M_payload._16_1_ == '\x01') {
                            nVar10 = detail::
                                     basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                     ::get_child(pbVar14,nVar5 & (I256|I48),
                                                 (psVar11->super_iter_result).child_index);
                            bVar7 = optimistic_lock::check
                                              ((optimistic_lock *)local_60,
                                               (version_type)c_critical_section.lock);
                            if (!bVar7) goto LAB_00140485;
                            bVar7 = try_right_most_traversal
                                              (this,(olc_node_ptr)nVar10.tagged_ptr,
                                               (read_critical_section *)local_60);
                            this_00 = (version_type *)(ulong)bVar7;
                            bVar7 = false;
                          }
                          else {
                            pop(this);
                            if ((((header_type *)local_60)->m_lock).read_lock_count.
                                super___atomic_base<long>._M_i < 1) goto LAB_00140616;
                            poVar15 = (optimistic_lock *)
                                      (((header_type *)local_60)->m_lock).version.version.
                                      super___atomic_base<unsigned_long>._M_i;
                            bVar7 = c_critical_section.lock == poVar15;
                            if (bVar7) {
LAB_00140453:
                              LOCK();
                              paVar2 = &(((header_type *)local_60)->m_lock).read_lock_count;
                              lVar12 = (paVar2->super___atomic_base<long>)._M_i;
                              (paVar2->super___atomic_base<long>)._M_i =
                                   (paVar2->super___atomic_base<long>)._M_i + -1;
                              UNLOCK();
                              if (SBORROW8(lVar12,1) != (paVar2->super___atomic_base<long>)._M_i < 0
                                 ) goto LAB_001405f7;
                            }
                            else {
                              LOCK();
                              paVar2 = &(((header_type *)local_60)->m_lock).read_lock_count;
                              lVar12 = (paVar2->super___atomic_base<long>)._M_i;
                              (paVar2->super___atomic_base<long>)._M_i =
                                   (paVar2->super___atomic_base<long>)._M_i + -1;
                              UNLOCK();
                              if (SBORROW8(lVar12,1) != (paVar2->super___atomic_base<long>)._M_i < 0
                                 ) goto LAB_001405f7;
                              if (c_critical_section.lock == poVar15) goto LAB_00140453;
                            }
                            local_60 = (undefined1  [8])0x0;
                            this_00 = (version_type *)
                                      (ulong)((byte)this_00 & c_critical_section.lock == poVar15);
                          }
                        }
                        else {
LAB_00140485:
                          local_60 = (undefined1  [8])0x0;
                          bVar7 = false;
                          this_00 = (version_type *)0x0;
                        }
                        optimistic_lock::read_critical_section::~read_critical_section
                                  ((read_critical_section *)local_60);
                      } while (bVar7);
                      goto LAB_00140124;
                    }
                  }
                }
                else {
                  uVar13 = nxt.
                           super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                           ._M_payload._M_value.node.tagged_ptr._1_1_;
                  nVar10 = detail::
                           basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                           ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                        *)this_01,type,
                                       nxt.
                                       super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                       ._M_payload._M_value.node.tagged_ptr._1_1_);
                  bVar7 = optimistic_lock::check
                                    ((optimistic_lock *)parent_critical_section.version.version,
                                     (version_type)node_critical_section.lock);
                  if (!bVar7) goto LAB_001405a5;
                  if (*(long *)(c_critical_section.version.version + 8) < 1) goto LAB_00140616;
                  poVar15 = *(optimistic_lock **)c_critical_section.version.version;
                  if (parent_critical_section.lock != poVar15) {
                    LOCK();
                    plVar1 = (long *)(c_critical_section.version.version + 8);
                    lVar12 = *plVar1;
                    *plVar1 = *plVar1 + -1;
                    UNLOCK();
                    if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
                    if (parent_critical_section.lock != poVar15) goto LAB_00140579;
                  }
                  LOCK();
                  plVar1 = (long *)(c_critical_section.version.version + 8);
                  lVar12 = *plVar1;
                  *plVar1 = *plVar1 + -1;
                  UNLOCK();
                  if (SBORROW8(lVar12,1) != *plVar1 < 0) goto LAB_001405f7;
                  c_critical_section.version.version = 0;
                  if (parent_critical_section.lock == poVar15) {
                    bVar7 = try_push(this,(olc_node_ptr)key_prefix.f,
                                     nxt.
                                     super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                     ._M_payload._M_value.node.tagged_ptr._0_1_,uVar13,
                                     (key_prefix_snapshot)
                                     nxt.
                                     super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                     ._M_payload._8_8_,
                                     (read_critical_section *)&parent_critical_section.version);
                    if (bVar7) {
                      bVar7 = try_right_most_traversal
                                        (this,(olc_node_ptr)nVar10.tagged_ptr,
                                         (read_critical_section *)&parent_critical_section.version);
                      uVar8 = (uint)bVar7;
                      goto LAB_00140122;
                    }
                  }
                }
              }
LAB_001405ad:
              this_00 = (version_type *)0x0;
              goto LAB_00140124;
            }
            bVar7 = try_push(this,(olc_node_ptr)key_prefix.f,key_byte,fVar16.first,
                             (key_prefix_snapshot)remaining_key.field_0,
                             (read_critical_section *)&parent_critical_section.version);
            if (!bVar7) goto LAB_001404c2;
            key_prefix = *(key_prefix_snapshot *)fVar16.second;
            nxt.
            super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
            ._24_8_ = (ulong)nxt.
                             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                             ._24_8_ >> 8;
            bVar7 = optimistic_lock::check
                              ((optimistic_lock *)parent_critical_section.version.version,
                               (version_type)node_critical_section.lock);
            if (!bVar7) {
LAB_001404e0:
              parent_critical_section.version.version = 0;
              goto LAB_001404c2;
            }
            c_critical_section.version = parent_critical_section.version;
            parent_critical_section.lock = node_critical_section.lock;
            parent_critical_section.version.version = 0;
            bVar7 = true;
          }
        }
        uVar13 = SUB81(this_00,0);
        optimistic_lock::read_critical_section::~read_critical_section
                  ((read_critical_section *)&parent_critical_section.version);
      } while (bVar7);
      goto LAB_001405d7;
    }
    c_critical_section.version.version = 0;
  }
  uVar13 = 0;
LAB_001405d7:
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)&c_critical_section.version);
  return (bool)(uVar13 & 1);
}

Assistant:

bool olc_db<Key, Value>::iterator::try_seek(art_key_type search_key,
                                            bool& match, bool fwd) {
  invalidate();   // invalidate the iterator (clear the stack).
  match = false;  // unless we wind up with an exact match.
  auto parent_critical_section = db_.root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return false;
    // LCOV_EXCL_STOP
  }
  auto node{db_.root.load()};
  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {
    return UNODB_DETAIL_LIKELY(parent_critical_section.try_read_unlock());
  }
  // A check() is required before acting on [node] by taking the lock.
  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return false;
    // LCOV_EXCL_STOP
  }
  const auto k = search_key;
  auto remaining_key{k};
  while (true) {
    UNODB_DETAIL_ASSERT(node != nullptr);
    // Lock version chaining (node and parent)
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart()))
      return false;  // LCOV_EXCL_LINE
    // TODO(thompsonbry) Should be redundant.  Checked before entering
    // the while() loop and at the bottom of the while() loop.
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return false;
    // Note: We DO NOT unlock the parent_critical_section here.  It is
    // done below along all code paths.
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      if (UNODB_DETAIL_UNLIKELY(
              !parent_critical_section.try_read_unlock()))  // unlock parent
        return false;                                       // LCOV_EXCL_LINE
      const auto* const leaf{node.template ptr<leaf_type*>()};
      if (UNODB_DETAIL_UNLIKELY(!try_push_leaf(node, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      const auto cmp_ = leaf->cmp(k);
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return false;  // LCOV_EXCL_LINE
      if (cmp_ == 0) {
        match = true;
        return true;  // done
      }
      if (fwd) {  // GTE semantics
        // if search_key < leaf, use leaf, else next().
        return (cmp_ < 0) ? true : try_next();
      }
      // LTE semantics: if search_key > leaf, use leaf, else prior().
      return (cmp_ > 0) ? true : try_prior();
    }
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);
    auto* const inode{node.template ptr<inode_type*>()};  // some internal node.
    const auto key_prefix{inode->get_key_prefix().get_snapshot()};  // prefix
    const auto key_prefix_length{key_prefix.length()};  // length of that prefix
    const auto shared_length = key_prefix.get_shared_length(
        remaining_key.get_u64());  // #of prefix bytes matched.
    if (shared_length < key_prefix_length) {
      // We have visited an internal node whose prefix is longer than
      // the bytes in the key that we need to match.  To figure out
      // whether the search key would be located before or after the
      // current internal node, we need to compare the respective key
      // spans lexicographically.  Since we have [shared_length] bytes
      // in common, we know that the next byte will tell us the
      // relative ordering of the key vs the prefix. So now we compare
      // prefix and key and the first byte where they differ.
      const auto cmp_ = static_cast<int>(remaining_key[shared_length]) -
                        static_cast<int>(key_prefix[shared_length]);
      UNODB_DETAIL_ASSERT(cmp_ != 0);
      if (fwd) {
        // Note: parent_critical_section is unlocked along all paths
        // by try_(left|right)_most_traversal
        if (cmp_ < 0) {
          // FWD and the search key is ordered before this node.  We
          // want the left-most leaf under the node.
          return unlock_and_return(
              node_critical_section,
              try_left_most_traversal(node, parent_critical_section));
        }
        // FWD and the search key is ordered after this node.  Right
        // most descent and then next().
        return unlock_and_return(
                   node_critical_section,
                   try_right_most_traversal(node, parent_critical_section)) &&
               try_next();
      }
      // reverse traversal
      if (cmp_ < 0) {
        // REV and the search key is ordered before this node.  We
        // want the preceeding key.
        return unlock_and_return(
                   node_critical_section,
                   try_left_most_traversal(node, parent_critical_section)) &&
               try_prior();
      }
      // REV and the search key is ordered after this node.
      return unlock_and_return(
          node_critical_section,
          try_right_most_traversal(node, parent_critical_section));
    }
    remaining_key.shift_right(key_prefix_length);
    const auto res = inode->find_child(node_type, remaining_key[0]);
    if (res.second == nullptr) {
      // We are on a key byte during the descent that is not mapped by
      // the current node.  Where we go next depends on whether we are
      // doing forward or reverse traversal.
      if (fwd) {
        // FWD: Take the next child_index that is mapped in the data
        // and then do a left-most descent to land on the key that is
        // the immediate successor of the desired key in the data.
        //
        // Note: We are probing with a key byte which does not appear
        // in our list of keys (this was verified above) so this will
        // always be the index the first entry whose key byte is
        // greater-than the probe value and [false] if there is no
        // such entry.
        //
        // Note: [node] has not been pushed onto the stack yet!
        auto nxt = inode->gte_key_byte(node_type, remaining_key[0]);
        if (!nxt) {
          // Pop entries off the stack until we find one with a
          // right-sibling of the path we took to this node and then
          // do a left-most descent under that right-sibling. If there
          // is no such parent, we will wind up with an empty stack
          // (aka the end() iterator) and return that state.
          if (UNODB_DETAIL_UNLIKELY(
                  !parent_critical_section.try_read_unlock()))  // unlock parent
            return false;  // LCOV_EXCL_LINE
          if (UNODB_DETAIL_UNLIKELY(
                  !node_critical_section.try_read_unlock()))  // unlock node
            return false;                                     // LCOV_EXCL_LINE
          if (!empty()) pop();
          while (!empty()) {
            const auto& centry = top();
            const auto cnode{centry.node};  // a possible parent from the stack.
            auto c_critical_section(
                node_ptr_lock(cnode).rehydrate_read_lock(centry.version));
            if (UNODB_DETAIL_UNLIKELY(!c_critical_section.check()))
              return false;  // LCOV_EXCL_LINE
            auto* const icnode{cnode.template ptr<inode_type*>()};
            const auto cnxt = icnode->next(
                cnode.type(), centry.child_index);  // right-sibling.
            if (cnxt) {
              auto nchild = icnode->get_child(
                  cnode.type(), centry.child_index);  // get the child
              if (UNODB_DETAIL_UNLIKELY(
                      !c_critical_section.check()))  // before using [nchild]
                return false;                        // LCOV_EXCL_LINE
              return try_left_most_traversal(nchild, c_critical_section);
            }
            pop();
            if (UNODB_DETAIL_UNLIKELY(!c_critical_section.try_read_unlock()))
              return false;  // LCOV_EXCL_LINE
          }
          return true;  // stack is empty (aka end()).
        }
        const auto& tmp = nxt.value();  // unwrap.
        const auto child_index = tmp.child_index;
        const auto child =
            inode->get_child(node_type, child_index);  // get child
        if (UNODB_DETAIL_UNLIKELY(
                !node_critical_section.check()))  // before using [child]
          return false;                           // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(
                !parent_critical_section.try_read_unlock()))  // unlock parent
          return false;                                       // LCOV_EXCL_LINE
        // push the path we took
        if (UNODB_DETAIL_UNLIKELY(!try_push(node, tmp.key_byte, child_index,
                                            tmp.prefix, node_critical_section)))
          return false;  // LCOV_EXCL_LINE
        return try_left_most_traversal(child, node_critical_section);
      }
      // REV: Take the prior child_index that is mapped and then do
      // a right-most descent to land on the key that is the
      // immediate precessor of the desired key in the data.
      auto nxt = inode->lte_key_byte(node_type, remaining_key[0]);
      if (!nxt) {
        // Pop off the current entry until we find one with a
        // left-sibling and then do a right-most descent under that
        // left-sibling.  In the extreme case there is no such
        // previous entry and we will wind up with an empty stack.
        if (UNODB_DETAIL_UNLIKELY(
                !parent_critical_section.try_read_unlock()))  // unlock parent
          return false;                                       // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(
                !node_critical_section.try_read_unlock()))  // unlock node
          return false;                                     // LCOV_EXCL_LINE
        if (!empty()) pop();
        while (!empty()) {
          const auto& centry = top();
          const auto cnode{centry.node};  // a possible parent from stack
          auto c_critical_section(
              node_ptr_lock(cnode).rehydrate_read_lock(centry.version));
          if (UNODB_DETAIL_UNLIKELY(!c_critical_section.check()))
            return false;  // LCOV_EXCL_LINE
          auto* const icnode{cnode.template ptr<inode_type*>()};
          const auto cnxt =
              icnode->prior(cnode.type(), centry.child_index);  // left-sibling.
          if (cnxt) {
            auto nchild = icnode->get_child(
                cnode.type(), centry.child_index);  // get the child
            if (UNODB_DETAIL_UNLIKELY(
                    !c_critical_section.check()))  // before using [nchild]
              return false;                        // LCOV_EXCL_LINE
            return try_right_most_traversal(nchild, c_critical_section);
          }
          pop();
          if (UNODB_DETAIL_UNLIKELY(!c_critical_section.try_read_unlock()))
            return false;  // LCOV_EXCL_LINE
        }
        return true;  // stack is empty (aka end()).
      }
      const auto& tmp = nxt.value();  // unwrap.
      const auto child_index = tmp.child_index;
      const auto child =
          inode->get_child(node_type, child_index);  // get the child
      if (UNODB_DETAIL_UNLIKELY(
              !node_critical_section.check()))  // before using [child]
        return false;                           // LCOV_EXCL_LINE
      if (UNODB_DETAIL_UNLIKELY(
              !parent_critical_section.try_read_unlock()))  // unlock parent
        return false;                                       // LCOV_EXCL_LINE
      // push the path we took
      if (UNODB_DETAIL_UNLIKELY(!try_push(node, tmp.key_byte, child_index,
                                          tmp.prefix, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      return try_right_most_traversal(child, node_critical_section);
    }
    // Simple case. There is a child for the current key byte.
    const auto child_index{res.first};
    const auto* const child{res.second};
    if (UNODB_DETAIL_UNLIKELY(!try_push(node, remaining_key[0], child_index,
                                        key_prefix, node_critical_section)))
      return false;  // LCOV_EXCL_LINE
    node = *child;
    remaining_key.shift_right(1);
    // check node before using [child] and before we std::move() the RCS.
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))
      return false;  // LCOV_EXCL_LINE
    // Move RCS (will check invariant at top of loop)
    parent_critical_section = std::move(node_critical_section);
  }  // while ( true )
  UNODB_DETAIL_CANNOT_HAPPEN();
}